

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

void __thiscall QToolBoxPrivate::updateTabs(QToolBoxPrivate *this)

{
  QToolBoxButton *this_00;
  bool bVar1;
  ColorRole CVar2;
  pointer pPVar3;
  QPalette *pQVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  QWidget *tW;
  QToolBoxButton *tB;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *page;
  PageList *__range1;
  int index;
  bool after;
  QToolBoxButton *lastButton;
  iterator __end1;
  iterator __begin1;
  QPalette p;
  undefined4 in_stack_ffffffffffffff78;
  ColorRole in_stack_ffffffffffffff7c;
  QWidget *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  ColorRole in_stack_ffffffffffffff8c;
  QToolBoxButton *pQVar6;
  QToolBoxButton *palette;
  int local_40;
  __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
  local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&in_RDI[0x10].field_0x18 == 0) {
    pQVar6 = (QToolBoxButton *)0x0;
  }
  else {
    pQVar6 = (QToolBoxButton *)**(undefined8 **)&in_RDI[0x10].field_0x18;
  }
  bVar5 = false;
  local_40 = 0;
  local_20._M_current =
       (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
       &DAT_aaaaaaaaaaaaaaaa;
  palette = pQVar6;
  local_20._M_current =
       (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
       std::
       vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
       ::begin((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                *)in_stack_ffffffffffffff80);
  std::
  vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
  ::end((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
         *)in_stack_ffffffffffffff80);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
    ::operator*(&local_20);
    pPVar3 = std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::
             operator->((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                         *)0x7025d0);
    this_00 = pPVar3->button;
    QToolBoxButton::setIndex(this_00,local_40);
    std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::operator->
              ((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
               0x7025f0);
    if (bVar5) {
      local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = QWidget::palette(in_stack_ffffffffffffff80);
      QPalette::QPalette((QPalette *)local_18,(QPalette *)pQVar4);
      in_stack_ffffffffffffff8c =
           QWidget::backgroundRole
                     ((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff80 = (QWidget *)QWidget::palette(in_stack_ffffffffffffff80);
      QWidget::backgroundRole
                ((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      QPalette::color((QPalette *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      QPalette::setColor((QPalette *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                         (QColor *)0x702677);
      QWidget::setPalette(in_RDI,(QPalette *)palette);
      QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QPalette::~QPalette((QPalette *)local_18);
    }
    else {
      CVar2 = QWidget::backgroundRole
                        ((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (CVar2 != Window) {
        QWidget::setBackgroundRole(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
    }
    bVar5 = this_00 == pQVar6;
    local_40 = local_40 + 1;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
    ::operator++(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBoxPrivate::updateTabs()
{
    QToolBoxButton *lastButton = currentPage ? currentPage->button : nullptr;
    bool after = false;
    int index = 0;
    for (const auto &page : pageList) {
        QToolBoxButton *tB = page->button;
        // update indexes, since the updates are delayed, the indexes will be correct
        // when we actually paint.
        tB->setIndex(index);
        QWidget *tW = page->widget;
        if (after) {
            QPalette p = tB->palette();
            p.setColor(tB->backgroundRole(), tW->palette().color(tW->backgroundRole()));
            tB->setPalette(p);
            tB->update();
        } else if (tB->backgroundRole() != QPalette::Window) {
            tB->setBackgroundRole(QPalette::Window);
            tB->update();
        }
        after = tB == lastButton;
        ++index;
    }
}